

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastEntityStatePdu.cpp
# Opt level: O2

void __thiscall DIS::FastEntityStatePdu::unmarshal(FastEntityStatePdu *this,DataStream *dataStream)

{
  byte bVar1;
  size_t idx;
  long lVar2;
  ArticulationParameter x;
  ArticulationParameter AStack_48;
  
  EntityInformationFamilyPdu::unmarshal(&this->super_EntityInformationFamilyPdu,dataStream);
  DataStream::operator>>
            (dataStream,
             (unsigned_short *)&(this->super_EntityInformationFamilyPdu).super_Pdu.field_0x14);
  DataStream::operator>>
            (dataStream,
             (unsigned_short *)&(this->super_EntityInformationFamilyPdu).super_Pdu.field_0x16);
  DataStream::operator>>(dataStream,&this->_entity);
  DataStream::operator>>(dataStream,&this->_forceId);
  DataStream::operator>>(dataStream,&this->_numberOfArticulationParameters);
  DataStream::operator>>(dataStream,&this->_entityKind);
  DataStream::operator>>(dataStream,&this->_domain);
  DataStream::operator>>(dataStream,&this->_country);
  DataStream::operator>>(dataStream,&this->_category);
  DataStream::operator>>(dataStream,&this->_subcategory);
  DataStream::operator>>(dataStream,&this->_specific);
  DataStream::operator>>(dataStream,&this->_extra);
  DataStream::operator>>(dataStream,&this->_altEntityKind);
  DataStream::operator>>(dataStream,&this->_altDomain);
  DataStream::operator>>(dataStream,&this->_altCountry);
  DataStream::operator>>(dataStream,&this->_altCategory);
  DataStream::operator>>(dataStream,&this->_altSubcategory);
  DataStream::operator>>(dataStream,&this->_altSpecific);
  DataStream::operator>>(dataStream,&this->_altExtra);
  DataStream::operator>>(dataStream,&this->_xVelocity);
  DataStream::operator>>(dataStream,&this->_yVelocity);
  DataStream::operator>>(dataStream,&this->_zVelocity);
  DataStream::operator>>(dataStream,&this->_xLocation);
  DataStream::operator>>(dataStream,&this->_yLocation);
  DataStream::operator>>(dataStream,&this->_zLocation);
  DataStream::operator>>(dataStream,&this->_psi);
  DataStream::operator>>(dataStream,&this->_theta);
  DataStream::operator>>(dataStream,&this->_phi);
  DataStream::operator>>(dataStream,&this->_entityAppearance);
  DataStream::operator>>(dataStream,&this->_deadReckoningAlgorithm);
  for (lVar2 = 0; lVar2 != 0xf; lVar2 = lVar2 + 1) {
    DataStream::operator>>(dataStream,this->_otherParameters + lVar2);
  }
  DataStream::operator>>(dataStream,&this->_xAcceleration);
  DataStream::operator>>(dataStream,&this->_yAcceleration);
  DataStream::operator>>(dataStream,&this->_zAcceleration);
  DataStream::operator>>(dataStream,&this->_xAngularVelocity);
  DataStream::operator>>(dataStream,&this->_yAngularVelocity);
  DataStream::operator>>(dataStream,&this->_zAngularVelocity);
  for (lVar2 = 0; lVar2 != 0xc; lVar2 = lVar2 + 1) {
    DataStream::operator>>(dataStream,this->_marking + lVar2);
  }
  DataStream::operator>>(dataStream,&this->_capabilities);
  std::vector<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>::clear
            (&this->_articulationParameters);
  for (bVar1 = 0; bVar1 < this->_numberOfArticulationParameters; bVar1 = bVar1 + 1) {
    ArticulationParameter::ArticulationParameter(&AStack_48);
    ArticulationParameter::unmarshal(&AStack_48,dataStream);
    std::vector<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>::push_back
              (&this->_articulationParameters,&AStack_48);
    ArticulationParameter::~ArticulationParameter(&AStack_48);
  }
  return;
}

Assistant:

void FastEntityStatePdu::unmarshal(DataStream& dataStream)
{
    EntityInformationFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    dataStream >> _site;
    dataStream >> _application;
    dataStream >> _entity;
    dataStream >> _forceId;
    dataStream >> _numberOfArticulationParameters;
    dataStream >> _entityKind;
    dataStream >> _domain;
    dataStream >> _country;
    dataStream >> _category;
    dataStream >> _subcategory;
    dataStream >> _specific;
    dataStream >> _extra;
    dataStream >> _altEntityKind;
    dataStream >> _altDomain;
    dataStream >> _altCountry;
    dataStream >> _altCategory;
    dataStream >> _altSubcategory;
    dataStream >> _altSpecific;
    dataStream >> _altExtra;
    dataStream >> _xVelocity;
    dataStream >> _yVelocity;
    dataStream >> _zVelocity;
    dataStream >> _xLocation;
    dataStream >> _yLocation;
    dataStream >> _zLocation;
    dataStream >> _psi;
    dataStream >> _theta;
    dataStream >> _phi;
    dataStream >> _entityAppearance;
    dataStream >> _deadReckoningAlgorithm;

     for(size_t idx = 0; idx < 15; idx++)
     {
        dataStream >> _otherParameters[idx];
     }

    dataStream >> _xAcceleration;
    dataStream >> _yAcceleration;
    dataStream >> _zAcceleration;
    dataStream >> _xAngularVelocity;
    dataStream >> _yAngularVelocity;
    dataStream >> _zAngularVelocity;

     for(size_t idx = 0; idx < 12; idx++)
     {
        dataStream >> _marking[idx];
     }

    dataStream >> _capabilities;

     _articulationParameters.clear();
     for(unsigned char idx = 0; idx < _numberOfArticulationParameters; idx++)
     {
        ArticulationParameter x;
        x.unmarshal(dataStream);
        _articulationParameters.push_back(x);
     }
}